

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.cpp
# Opt level: O3

void __thiscall r_exec::Overlay::unpatch_code(Overlay *this,uint16_t patch_index)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  pointer puVar3;
  ulong uVar4;
  uint uVar5;
  undefined6 in_register_00000032;
  ulong __new_size;
  
  iVar1 = (*(this->controller->super__Object)._vptr__Object[4])();
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar1),0);
  uVar5 = (uint)CONCAT62(in_register_00000032,patch_index);
  __new_size = CONCAT62(in_register_00000032,patch_index) & 0xffffffff;
  puVar3 = (this->patch_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = __new_size;
  if (__new_size <
      (ulong)((long)(this->patch_indices).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3 >> 1)) {
    do {
      uVar5 = uVar5 + 1;
      r_code::Atom::operator=
                (this->code + (ulong)puVar3[uVar4] * 4,(Atom *)((ulong)puVar3[uVar4] * 4 + lVar2));
      puVar3 = (this->patch_indices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (ulong)(uVar5 & 0xffff);
    } while ((ulong)(uVar5 & 0xffff) <
             (ulong)((long)(this->patch_indices).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 1));
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->patch_indices,__new_size);
  return;
}

Assistant:

void Overlay::unpatch_code(uint16_t patch_index)
{
    Code *object = get_core_object();
    Atom *original_code = &object->code(0);

    for (uint16_t i = patch_index; i < patch_indices.size(); ++i) {
        code[patch_indices[i]] = original_code[patch_indices[i]];
    }

    patch_indices.resize(patch_index);
}